

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_formatimpl.cpp
# Opt level: O2

int32_t __thiscall
icu_63::number::impl::NumberFormatterImpl::format
          (NumberFormatterImpl *this,DecimalQuantity *inValue,NumberStringBuilder *outString,
          UErrorCode *status)

{
  int32_t end;
  int32_t iVar1;
  MicroProps micros;
  MicroProps MStack_118;
  
  MicroProps::MicroProps(&MStack_118);
  preProcess(this,inValue,&MStack_118,status);
  iVar1 = 0;
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    end = writeNumber(&MStack_118,inValue,outString,0,status);
    iVar1 = writeAffixes(&MStack_118,outString,0,end,status);
    iVar1 = iVar1 + end;
  }
  MicroProps::~MicroProps(&MStack_118);
  return iVar1;
}

Assistant:

int32_t NumberFormatterImpl::format(DecimalQuantity& inValue, NumberStringBuilder& outString,
                                UErrorCode& status) const {
    MicroProps micros;
    preProcess(inValue, micros, status);
    if (U_FAILURE(status)) { return 0; }
    int32_t length = writeNumber(micros, inValue, outString, 0, status);
    length += writeAffixes(micros, outString, 0, length, status);
    return length;
}